

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O0

Box<Dims> * adios2::helper::IntersectionBox(Box<Dims> *box1,Box<Dims> *box2)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  Box<Dims> *in_RDI;
  size_t d_1;
  size_t d;
  size_t dimensionsSize;
  Box<Dims> *intersectionBox;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_ffffffffffffff80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff90;
  value_type in_stack_ffffffffffffffa8;
  Box<Dims> *this;
  size_type local_40;
  size_type local_30;
  
  this = in_RDI;
  std::
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
            (in_stack_ffffffffffffff80);
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
  local_30 = 0;
  while( true ) {
    if (sVar2 <= local_30) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (&this->first,in_stack_ffffffffffffffa8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (&this->first,in_stack_ffffffffffffffa8);
      for (local_40 = 0; local_40 < sVar2; local_40 = local_40 + 1) {
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RSI,local_40);
        uVar1 = *pvVar3;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDX,local_40);
        if (uVar1 < *pvVar3) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDX,local_40);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (in_stack_ffffffffffffff90,(value_type *)in_stack_ffffffffffffff88);
        }
        else {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,local_40);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (in_stack_ffffffffffffff90,(value_type *)in_stack_ffffffffffffff88);
        }
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RSI + 1,local_40);
        in_stack_ffffffffffffff90 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar3
        ;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDX + 1,local_40);
        if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar3 <
            in_stack_ffffffffffffff90) {
          in_stack_ffffffffffffff88 = &this->second;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (in_RDX + 1,local_40);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (in_stack_ffffffffffffff90,(value_type *)in_stack_ffffffffffffff88);
        }
        else {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (in_RSI + 1,local_40);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (in_stack_ffffffffffffff90,(value_type *)in_stack_ffffffffffffff88);
        }
      }
      return in_RDI;
    }
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDX,local_30)
    ;
    in_stack_ffffffffffffffa8 = *pvVar3;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RSI + 1,local_30);
    if (*pvVar3 < in_stack_ffffffffffffffa8) break;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RDX + 1,local_30);
    uVar1 = *pvVar3;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,local_30)
    ;
    if (uVar1 < *pvVar3) {
      return in_RDI;
    }
    local_30 = local_30 + 1;
  }
  return in_RDI;
}

Assistant:

Box<Dims> IntersectionBox(const Box<Dims> &box1, const Box<Dims> &box2) noexcept
{
    Box<Dims> intersectionBox;
    const size_t dimensionsSize = box1.first.size();

    for (size_t d = 0; d < dimensionsSize; ++d)
    {
        // Don't intercept
        if (box2.first[d] > box1.second[d] || box2.second[d] < box1.first[d])
        {
            return intersectionBox;
        }
    }

    // get the intersection box
    intersectionBox.first.reserve(dimensionsSize);
    intersectionBox.second.reserve(dimensionsSize);

    for (size_t d = 0; d < dimensionsSize; ++d)
    {
        // start
        if (box1.first[d] < box2.first[d])
        {
            intersectionBox.first.push_back(box2.first[d]);
        }
        else
        {
            intersectionBox.first.push_back(box1.first[d]);
        }

        // end, must be inclusive
        if (box1.second[d] > box2.second[d])
        {
            intersectionBox.second.push_back(box2.second[d]);
        }
        else
        {
            intersectionBox.second.push_back(box1.second[d]);
        }
    }

    return intersectionBox;
}